

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

int32_t __thiscall fasttext::FastText::getLabelId(FastText *this,string *label)

{
  int32_t iVar1;
  int32_t iVar2;
  
  iVar1 = Dictionary::getId((this->dict_).
                            super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,label);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    iVar2 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    iVar1 = iVar1 - iVar2;
  }
  return iVar1;
}

Assistant:

int32_t FastText::getLabelId(const std::string& label) const {
  int32_t labelId = dict_->getId(label);
  if (labelId != -1) {
    labelId -= dict_->nwords();
  }
  return labelId;
}